

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

void __thiscall Directory::Directory(Directory *this)

{
  Directory *this_local;
  
  String::String(&this->dirpath);
  String::String(&this->pattern);
  this->dp = (void *)0x0;
  return;
}

Assistant:

Directory::Directory()
{
#ifdef _WIN32
  ASSERT(sizeof(ffd) >= sizeof(WIN32_FIND_DATA));
  findFile = INVALID_HANDLE_VALUE;
#else
  dp = 0;
#endif
}